

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UBool __thiscall
icu_63::UnicodeString::padTrailing(UnicodeString *this,int32_t targetLength,UChar padChar)

{
  short sVar1;
  UBool UVar2;
  char16_t *pcVar3;
  long lVar4;
  int32_t iVar5;
  UBool UVar6;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  UVar6 = '\0';
  if (iVar5 < targetLength) {
    UVar2 = cloneArrayIfNeeded(this,targetLength,-1,'\x01',(int32_t **)0x0,'\0');
    UVar6 = '\0';
    if (UVar2 != '\0') {
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar3 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (char16_t *)((long)&this->fUnion + 2);
      }
      for (lVar4 = (long)targetLength; iVar5 < lVar4; lVar4 = lVar4 + -1) {
        pcVar3[lVar4 + -1] = padChar;
      }
      setLength(this,targetLength);
      UVar6 = '\x01';
    }
  }
  return UVar6;
}

Assistant:

UBool 
UnicodeString::padTrailing(int32_t targetLength,
                           UChar padChar)
{
  int32_t oldLength = length();
  if(oldLength >= targetLength || !cloneArrayIfNeeded(targetLength)) {
    return FALSE;
  } else {
    // fill in padding character
    UChar *array = getArrayStart();
    int32_t length = targetLength;
    while(--length >= oldLength) {
      array[length] = padChar;
    }
    setLength(targetLength);
    return TRUE;
  }
}